

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

double __thiscall IF97::BaseRegion::cvmass(BaseRegion *this,double T,double p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double PI;
  double tau;
  double p_local;
  double T_local;
  BaseRegion *this_local;
  
  dVar6 = this->T_star;
  dVar2 = p / this->p_star;
  dVar3 = cpmass(this,T,p);
  dVar1 = this->R;
  dVar4 = dgammar_dPI(this,T,p);
  dVar5 = d2gammar_dPIdTAU(this,T,p);
  dVar6 = powi(-((dVar6 / T) * dVar2) * dVar5 + dVar2 * dVar4 + 1.0,2);
  dVar4 = d2gammar_dPI2(this,T,p);
  return dVar3 - (dVar1 * dVar6) / (-(dVar2 * dVar2) * dVar4 + 1.0);
}

Assistant:

virtual double cvmass(double T, double p) const{
            const double tau = T_star/T, PI = p/p_star;
            return cpmass(T,p)-R*powi(1 + PI*dgammar_dPI(T,p) - tau*PI*d2gammar_dPIdTAU(T,p),2)/(1-PI*PI*d2gammar_dPI2(T, p));
        }